

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Output::canElideEmptySequence(Output *this)

{
  reference pIVar1;
  bool bVar2;
  
  bVar2 = true;
  if (1 < (this->StateStack).super_SmallVectorImpl<llvm::yaml::Output::InState>.
          super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
          super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.super_SmallVectorBase.
          Size) {
    pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                       ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                        &this->StateStack);
    if (*pIVar1 == inMapFirstKey) {
      pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::operator[]
                         ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                          &this->StateStack,
                          (ulong)(this->StateStack).
                                 super_SmallVectorImpl<llvm::yaml::Output::InState>.
                                 super_SmallVectorTemplateBase<llvm::yaml::Output::InState,_true>.
                                 super_SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>.
                                 super_SmallVectorBase.Size - 2);
      bVar2 = inSeqOtherElement < *pIVar1;
    }
  }
  return bVar2;
}

Assistant:

bool Output::canElideEmptySequence() {
  // Normally, with an optional key/value where the value is an empty sequence,
  // the whole key/value can be not written.  But, that produces wrong yaml
  // if the key/value is the only thing in the map and the map is used in
  // a sequence.  This detects if the this sequence is the first key/value
  // in map that itself is embedded in a sequnce.
  if (StateStack.size() < 2)
    return true;
  if (StateStack.back() != inMapFirstKey)
    return true;
  return !inSeqAnyElement(StateStack[StateStack.size() - 2]);
}